

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_gains.hpp
# Opt level: O0

void __thiscall
ear::OutputGainMatVecT<float>::check_size(OutputGainMatVecT<float> *this,size_t rows,size_t cols)

{
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *this_00;
  bool bVar1;
  size_type sVar2;
  invalid_argument *piVar3;
  allocator<char> local_99;
  string local_98;
  reference local_78;
  vector<float,_std::allocator<float>_> *col;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *__range2;
  allocator<char> local_41;
  string local_40;
  size_type local_20;
  size_t cols_local;
  size_t rows_local;
  OutputGainMatVecT<float> *this_local;
  
  local_20 = cols;
  cols_local = rows;
  rows_local = (size_t)this;
  sVar2 = std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::size(this->mat);
  if (sVar2 != local_20) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"incorrect number of cols in output matrix",&local_41);
    invalid_argument::invalid_argument(piVar3,&local_40);
    __cxa_throw(piVar3,&invalid_argument::typeinfo,invalid_argument::~invalid_argument);
  }
  this_00 = this->mat;
  __end0 = std::
           vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ::begin(this_00);
  col = (vector<float,_std::allocator<float>_> *)
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                                *)&col);
    if (!bVar1) {
      return;
    }
    local_78 = __gnu_cxx::
               __normal_iterator<std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
               ::operator*(&__end0);
    sVar2 = std::vector<float,_std::allocator<float>_>::size(local_78);
    if (sVar2 != cols_local) break;
    __gnu_cxx::
    __normal_iterator<std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
    ::operator++(&__end0);
  }
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"incorrect number of rows in output matrix column",&local_99);
  invalid_argument::invalid_argument(piVar3,&local_98);
  __cxa_throw(piVar3,&invalid_argument::typeinfo,invalid_argument::~invalid_argument);
}

Assistant:

virtual void check_size(size_t rows, size_t cols) override {
      if (mat.size() != cols)
        throw invalid_argument("incorrect number of cols in output matrix");
      for (auto &col : mat)
        if (col.size() != rows)
          throw invalid_argument(
              "incorrect number of rows in output matrix column");
    }